

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_utils_leb128.c
# Opt level: O0

size_t lj_utils_write_leb128(uint8_t *buffer,int64_t value)

{
  size_t i;
  int64_t value_local;
  uint8_t *buffer_local;
  
  i = 0;
  for (value_local = value; 0x7f < value_local + 0x40U; value_local = value_local >> 7) {
    buffer[i] = (byte)value_local & 0x7f | 0x80;
    i = i + 1;
  }
  buffer[i] = (byte)value_local & 0x7f;
  return i + 1;
}

Assistant:

size_t LJ_FASTCALL lj_utils_write_leb128(uint8_t *buffer, int64_t value)
{
  size_t i = 0;

  /* LEB_SIGN_BIT propagation to check the remaining value. */
  while ((uint64_t)(value + LEB_SIGN_BIT) >= MIN_TWOBYTE_VALUE) {
    buffer[i++] = (uint8_t)((value & PAYLOAD_MASK) | LINK_BIT);
    value >>= SHIFT_STEP;
  }

  /* Omit LINK_BIT in case of overflow. */
  buffer[i++] = (uint8_t)(value & PAYLOAD_MASK);

  lj_assertX(i <= LEB128_U64_MAXSIZE, "bad leb128 size");

  return i;
}